

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_lcl.c
# Opt level: O1

err_t bignStart(void *state,bign_params *params)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  err_t eVar4;
  qr_o *r;
  void *stack;
  ulong no;
  
  sVar3 = params->l;
  no = sVar3 * 2 + 7 >> 3;
  sVar2 = gfpCreate_keep(no);
  sVar3 = ecpCreateJ_keep(sVar3 * 2 + 0x3f >> 6);
  r = (qr_o *)(sVar3 + (long)state);
  stack = (void *)((long)&(r->hdr).keep + sVar2);
  bVar1 = gfpCreate(r,params->p,no,stack);
  eVar4 = 0x1f6;
  if (bVar1 != 0) {
    bVar1 = ecpCreateJ((ec_o *)state,r,params->a,params->b,stack);
    if (bVar1 != 0) {
      bVar1 = ecCreateGroup((ec_o *)state,(octet *)0x0,params->yG,params->q,no,1,stack);
      if (bVar1 != 0) {
        objAppend(state,r,0);
        eVar4 = 0;
      }
    }
  }
  return eVar4;
}

Assistant:

err_t bignStart(void* state, const bign_params* params)
{
	// размерности
	size_t no, n;
	size_t f_keep;
	size_t ec_keep;
	// состояние
	qr_o* f;		/* поле */
	ec_o* ec;		/* кривая */
	void* stack;	/* вложенный стек */
	// pre
	ASSERT(memIsValid(params, sizeof(bign_params)));
	ASSERT(bignIsOperable(params));
	ASSERT(memIsValid(state, bignStart_keep(params->l, 0)));
	// определить размерности
	no = O_OF_B(2 * params->l);
	n = W_OF_B(2 * params->l);
	f_keep = gfpCreate_keep(no);
	ec_keep = ecpCreateJ_keep(n);
	// создать поле
	f = (qr_o*)((octet*)state + ec_keep);
	stack = (octet*)f + f_keep;
	if (!gfpCreate(f, params->p, no, stack))
		return ERR_BAD_PARAMS;
	ASSERT(wwBitSize(f->mod, n) == params->l * 2);
	ASSERT(wwGetBits(f->mod, 0, 2) == 3);
	// создать кривую и группу
	ec = (ec_o*)state;
	if (!ecpCreateJ(ec, f, params->a, params->b, stack) ||
		!ecCreateGroup(ec, 0, params->yG, params->q, no, 1, stack))
		return ERR_BAD_PARAMS;
	ASSERT(wwBitSize(ec->order, n) == params->l * 2);
	ASSERT(zzIsOdd(ec->order, n));
	// присоединить f к ec
	objAppend(ec, f, 0);
	// все нормально
	return ERR_OK;
}